

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_andi_(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  uint32_t uVar1;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = rA(ctx->opcode);
  ret = cpu_gpr[uVar1];
  uVar1 = rS(ctx->opcode);
  arg1 = cpu_gpr[uVar1];
  uVar1 = UIMM(ctx->opcode);
  tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret,arg1,(ulong)uVar1);
  uVar1 = rA(ctx->opcode);
  gen_set_Rc0(ctx,cpu_gpr[uVar1]);
  return;
}

Assistant:

static void gen_andi_(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    tcg_gen_andi_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rS(ctx->opcode)],
                    UIMM(ctx->opcode));
    gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
}